

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

void __thiscall nivalis::color::color::color(color *this,uint clr)

{
  undefined1 auVar1 [16];
  
  this->data[0] = (float)(clr >> 0x10 & 0xff) / 255.0;
  auVar1._0_4_ = (float)(clr >> 8 & 0xff);
  auVar1._4_4_ = (float)(clr & 0xff);
  auVar1._8_8_ = 0;
  auVar1 = divps(auVar1,_DAT_0021b600);
  *(long *)(this->data + 1) = auVar1._0_8_;
  this->data[3] = 1.0;
  this->r = this->data;
  this->g = this->data + 1;
  this->b = this->data + 2;
  this->a = this->data + 3;
  return;
}

Assistant:

color::color(unsigned clr)
    : color((clr& 0xFF0000) >> 16,
            (clr& 0xFF00) >> 8,
            clr& 0xFF, 255){}